

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode
JsGetTypedArrayStorage
          (JsValueRef instance,BYTE **buffer,uint *bufferLength,JsTypedArrayType *typedArrayType,
          int *elementSize)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  JsTypedArrayType JVar4;
  int iVar5;
  TypedArrayBase *pTVar6;
  RecyclableObject *this;
  undefined4 *puVar7;
  TypeId typeId;
  JsErrorCode JVar8;
  DebugCheckNoException local_40;
  RecyclableObject *local_38;
  
  if (instance == (JsValueRef)0x0) {
    JVar8 = JsErrorInvalidArgument;
  }
  else {
    if (bufferLength == (uint *)0x0 || buffer == (BYTE **)0x0) {
      return JsErrorNullArgument;
    }
    local_40.hasException = true;
    local_40.__exceptionCheck = ExceptionCheck::Save();
    bVar2 = Js::TaggedInt::Is(instance);
    if (bVar2) {
      typeId = TypeIds_FirstNumberType;
    }
    else if ((ulong)instance >> 0x32 == 0) {
      this = Js::UnsafeVarTo<Js::RecyclableObject>(instance);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        local_38 = this;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                           ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) goto LAB_0036be70;
        *puVar7 = 0;
        this = local_38;
      }
      typeId = ((this->type).ptr)->typeId;
      if ((0x57 < (int)typeId) && (BVar3 = Js::RecyclableObject::IsExternal(this), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        local_38 = (RecyclableObject *)__tls_get_addr(&PTR_013e5f18);
        *(undefined4 *)
         &(local_38->super_FinalizableObject).super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                           ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                           "GetTypeId aValue has invalid TypeId");
        if (!bVar2) goto LAB_0036be70;
        *(undefined4 *)
         &(local_38->super_FinalizableObject).super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject = 0;
      }
    }
    else {
      typeId = TypeIds_Number;
    }
    BVar3 = Js::TypedArrayBase::Is(typeId);
    if (BVar3 == 0) {
      JVar8 = JsErrorInvalidArgument;
    }
    else {
      pTVar6 = Js::VarTo<Js::TypedArrayBase>(instance);
      *buffer = pTVar6->buffer;
      *bufferLength =
           pTVar6->BYTES_PER_ELEMENT * (pTVar6->super_ArrayBufferParent).super_ArrayObject.length;
      if (typedArrayType != (JsTypedArrayType *)0x0) {
        JVar4 = GetTypedArrayType(typeId);
        *typedArrayType = JVar4;
      }
      if (elementSize == (int *)0x0) {
        JVar8 = JsNoError;
      }
      else {
        if (typeId - TypeIds_Int8Array < 9) {
          iVar5 = *(int *)(&DAT_00e0c4bc + (ulong)(typeId - TypeIds_Int8Array) * 4);
          JVar8 = JsNoError;
        }
        else {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Jsrt.cpp"
                             ,0x92f,"(0)","invalid typed array type");
          if (!bVar2) {
LAB_0036be70:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar7 = 0;
          JVar8 = JsErrorFatal;
          iVar5 = 1;
        }
        *elementSize = iVar5;
      }
    }
    local_40.hasException = false;
    DebugCheckNoException::~DebugCheckNoException(&local_40);
  }
  return JVar8;
}

Assistant:

END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsGetTypedArrayStorage(_In_ JsValueRef instance, _Outptr_result_bytebuffer_(*bufferLength) BYTE **buffer,
    _Out_ unsigned int *bufferLength, _Out_opt_ JsTypedArrayType *typedArrayType, _Out_opt_ int *elementSize)
{
    VALIDATE_JSREF(instance);
    PARAM_NOT_NULL(buffer);
    PARAM_NOT_NULL(bufferLength);

    BEGIN_JSRT_NO_EXCEPTION
    {
        const Js::TypeId typeId = Js::JavascriptOperators::GetTypeId(instance);
        if (!Js::TypedArrayBase::Is(typeId))
        {
            RETURN_NO_EXCEPTION(JsErrorInvalidArgument);
        }

        Js::TypedArrayBase* typedArrayBase = Js::VarTo<Js::TypedArrayBase>(instance);
        *buffer = typedArrayBase->GetByteBuffer();
        *bufferLength = typedArrayBase->GetByteLength();

        if (typedArrayType)
        {
            *typedArrayType = GetTypedArrayType(typeId);
        }

        if (elementSize)
        {
            switch (typeId)
            {
                case Js::TypeIds_Int8Array:
                    *elementSize = sizeof(int8);
                    break;
                case Js::TypeIds_Uint8Array:
                    *elementSize = sizeof(uint8);
                    break;
                case Js::TypeIds_Uint8ClampedArray:
                    *elementSize = sizeof(uint8);
                    break;
                case Js::TypeIds_Int16Array:
                    *elementSize = sizeof(int16);
                    break;
                case Js::TypeIds_Uint16Array:
                    *elementSize = sizeof(uint16);
                    break;
                case Js::TypeIds_Int32Array:
                    *elementSize = sizeof(int32);
                    break;
                case Js::TypeIds_Uint32Array:
                    *elementSize = sizeof(uint32);
                    break;
                case Js::TypeIds_Float32Array:
                    *elementSize = sizeof(float);
                    break;
                case Js::TypeIds_Float64Array:
                    *elementSize = sizeof(double);
                    break;
                default:
                    AssertMsg(FALSE, "invalid typed array type");
                    *elementSize = 1;
                    RETURN_NO_EXCEPTION(JsErrorFatal);
            }
        }
    }